

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

int __thiscall cppforth::Forth::accept(Forth *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  stringstream *psVar5;
  ulong uVar6;
  ulong uVar7;
  string line;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  requireDStackAvailable(this,2,"ACCEPT");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  if (this->readFromSource == FromStdCin) {
    psVar5 = (stringstream *)&std::cin;
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x15a598);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x68);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_50,cVar1);
  }
  else {
    if (this->readFromSource != FromString) goto LAB_00116dbb;
    psVar5 = &this->std_cin;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->std_cin + -0x18) + (int)psVar5);
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)psVar5 + -0x18) + (char)psVar5);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)psVar5,(string *)&local_50,cVar1);
  }
  std::ios::clear((int)psVar5 + (int)*(undefined8 *)(*(long *)psVar5 + -0x18));
LAB_00116dbb:
  uVar7 = (ulong)uVar2;
  if (local_48 < uVar2) {
    uVar7 = local_48;
  }
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (local_48 <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
      }
      dataSpaceSet(this,(int)uVar6 + uVar3,local_50[uVar6]);
      uVar6 = uVar6 + 1;
    } while ((uint)uVar6 < (uint)uVar7);
  }
  ForthStack<unsigned_int>::setTop(this_00,(uint)uVar7);
  iVar4 = extraout_EAX;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void accept() {
			REQUIRE_DSTACK_AVAILABLE(2, "ACCEPT");
			auto bufferSize = SIZE_T(dStack.getTop()); pop();
			auto buffer = CAddr(dStack.getTop());
			std::string line{};
			switch (readFromSource) {
			case FromString:
				std_cin.clear();
				std::getline(std_cin, line);
				std_cin.clear();
				break;
			case FromStdCin:
				std::cin.clear();
				std::getline(std::cin, line);
				std::cin.clear();
				break;
			default:
				break;
			}
				auto copySize = std::min(line.length(), bufferSize);
				for (Cell i = 0; i < copySize; ++i) {
					dataSpaceSet(buffer + i, line.at(i));
				}
				dStack.setTop(static_cast<Cell>(copySize));
		}